

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_hit.cpp
# Opt level: O2

void __thiscall embree::Tutorial::~Tutorial(Tutorial *this)

{
  SceneLoadingTutorialApplication::~SceneLoadingTutorialApplication
            (&this->super_SceneLoadingTutorialApplication);
  ::operator_delete(this);
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES)
    {
      registerOption("single_pass", [] (Ref<ParseStream> cin, const FileName& path) {
          g_next_hit_mode = SINGLE_PASS;
        }, "--single_pass: use special all hits kernel to gather all hits along ray");

      registerOption("multi_pass_fixed_next_hits", [] (Ref<ParseStream> cin, const FileName& path) {
          g_next_hit_mode = MULTI_PASS_FIXED_NEXT_HITS;
        }, "--multi_pass_fixed_next_hits: use multiple passes and gather a fixed number of hits each pass");

      registerOption("multi_pass_optimal_next_hits", [] (Ref<ParseStream> cin, const FileName& path) {
          g_next_hit_mode = MULTI_PASS_OPTIMAL_NEXT_HITS;
        }, "--multi_pass_optimal_next_hits: use multiple passes and gather the optimal number of hits (known from previous frame)");

      registerOption("multi_pass_estimate_next_hits", [] (Ref<ParseStream> cin, const FileName& path) {
          g_next_hit_mode = MULTI_PASS_ESTIMATED_NEXT_HITS;
        }, "--multi_pass_estimate_next_hits: use multiple passes and estimate the number of hits to gather from opacity");

      registerOption("max_next_hits", [] (Ref<ParseStream> cin, const FileName& path) {
          g_max_next_hits = cin->getInt();
        }, "--max_next_hits <int>: sets maximal number of hits to accumulate in each pass");

      registerOption("max_total_hits", [] (Ref<ParseStream> cin, const FileName& path) {
          g_max_total_hits = cin->getInt();
          if (g_max_total_hits > 16*1024)
            throw std::runtime_error("max_total_hits too large");
        }, "--max_total_hits <int>: sets maximal number of hits to accumulate in total");

      registerOption("curve_opacity", [] (Ref<ParseStream> cin, const FileName& path) {
          g_enable_opacity = true;
          g_curve_opacity = cin->getFloat();
        }, "--curve_opacity <float>: specifies opacity for curves, make surfaces opaque, enables stop at opaque surface, and enables roussian roulette ray termination");
      
      registerOption("verify", [] (Ref<ParseStream> cin, const FileName& path) {
          g_verify = true;
        }, "--verify: verifies result of collecting all hits");

      registerOption("visualize_errors", [] (Ref<ParseStream> cin, const FileName& path) {
          g_visualize_errors = true;
        }, "--visualize_errors: visualizes pixels where collected hits are wrong");
    }